

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O3

int nn_chunk_alloc(size_t size,int type,void **result)

{
  nn_atomic *self;
  int iVar1;
  
  iVar1 = -0xc;
  if (size < 0xffffffffffffffe0) {
    if (type == 0) {
      self = (nn_atomic *)nn_alloc_(size + 0x20);
      if (self != (nn_atomic *)0x0) {
        nn_atomic_init(self,1);
        *(size_t *)(self + 2) = size;
        *(code **)(self + 4) = nn_chunk_default_free;
        iVar1 = 0;
        nn_putl((uint8_t *)(self + 6),0);
        nn_putl((uint8_t *)(self + 7),0xdeadcafe);
        *result = self + 8;
      }
    }
    else {
      iVar1 = -0x16;
    }
  }
  return iVar1;
}

Assistant:

int nn_chunk_alloc (size_t size, int type, void **result)
{
    size_t sz;
    struct nn_chunk *self;
    const size_t hdrsz = nn_chunk_hdrsize ();

    /*  Compute total size to be allocated. Check for overflow. */
    sz = hdrsz + size;
    if (nn_slow (sz < hdrsz))
        return -ENOMEM;

    /*  Allocate the actual memory depending on the type. */
    switch (type) {
    case 0:
        self = nn_alloc (sz, "message chunk");
        break;
    default:
        return -EINVAL;
    }
    if (nn_slow (!self))
        return -ENOMEM;

    /*  Fill in the chunk header. */
    nn_atomic_init (&self->refcount, 1);
    self->size = size;
    self->ffn = nn_chunk_default_free;

    /*  Fill in the size of the empty space between the chunk header
        and the message. */
    nn_putl ((uint8_t*) ((uint32_t*) (self + 1)), 0);

    /*  Fill in the tag. */
    nn_putl ((uint8_t*) ((((uint32_t*) (self + 1))) + 1), NN_CHUNK_TAG);

    *result = nn_chunk_getdata (self);
    return 0;
}